

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::IsSpent(CWallet *this,COutPoint *outpoint)

{
  long lVar1;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var2;
  const_iterator cVar3;
  const_iterator it;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar4 = std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(this->mapTxSpends)._M_h,outpoint);
  for (_Var2._M_cur = (__node_type *)
                      pVar4.first.
                      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
      (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var2._M_cur !=
      pVar4.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
      super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
      _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
    cVar3 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->mapWallet)._M_h,
                   (key_type *)
                   ((long)&((_Var2._M_cur)->
                           super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                           super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                           _M_storage._M_storage + 0x24));
    if ((((cVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
           != (__node_type *)0x0) &&
         (*(char *)((long)cVar3.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1f8) != '\x02')) &&
        ((*(char *)((long)cVar3.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1f8) == '\x03' &
         *(byte *)((long)cVar3.
                         super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                         ._M_cur + 0x1d0)) == 0)) &&
       (*(long *)((long)cVar3.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x228) == 0)) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var2._M_cur !=
           pVar4.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur
           .super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsSpent(const COutPoint& outpoint) const
{
    std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range;
    range = mapTxSpends.equal_range(outpoint);

    for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
        const uint256& wtxid = it->second;
        const auto mit = mapWallet.find(wtxid);
        if (mit != mapWallet.end()) {
            const auto& wtx = mit->second;
            if (!wtx.isAbandoned() && !wtx.isBlockConflicted() && !wtx.isMempoolConflicted())
                return true; // Spent
        }
    }
    return false;
}